

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

Neuron * __thiscall
indk::NeuralNet::doReplicateNeuron(NeuralNet *this,string *from,string *to,bool integrate)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  ostream *poVar5;
  Neuron *this_01;
  int64_t iVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  _Alloc_hider ename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
  local_58;
  
  std::__cxx11::string::assign((char *)&this->PrepareID);
  this_00 = &this->Neurons;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
          ::find(&this_00->_M_t,from);
  p_Var1 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    iVar2 = System::getVerbosityLevel();
    if (iVar2 < 1) {
      return (Neuron *)0x0;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Neuron replication error: element ");
    poVar5 = std::operator<<(poVar5,(string *)from);
    pcVar7 = " not found";
  }
  else {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
            ::find(&this_00->_M_t,to);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      this_01 = (Neuron *)operator_new(0xc0);
      Neuron::Neuron(this_01,*(Neuron **)(iVar3._M_node + 2));
      Neuron::setName(this_01,to);
      std::__cxx11::string::string((string *)&local_58,(string *)to);
      local_58.second = this_01;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,indk::Neuron*>,std::_Select1st<std::pair<std::__cxx11::string_const,indk::Neuron*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,indk::Neuron*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,indk::Neuron*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,indk::Neuron*>,std::_Select1st<std::pair<std::__cxx11::string_const,indk::Neuron*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,indk::Neuron*>>>
                  *)this_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (integrate) {
        Neuron::getEntries_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58,this_01);
        for (ename._M_p = local_58.first._M_dataplus._M_p;
            ename._M_p != (pointer)local_58.first._M_string_length; ename._M_p = ename._M_p + 0x20)
        {
          iVar6 = doFindEntry(this,(string *)ename._M_p);
          if (iVar6 == -1) {
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                    ::find(&this_00->_M_t,(key_type *)ename._M_p);
            if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
              Neuron::doLinkOutput(*(Neuron **)(iVar3._M_node + 2),to);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&(this->Entries).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].second,to);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        return this_01;
      }
      return this_01;
    }
    iVar2 = System::getVerbosityLevel();
    if (iVar2 < 1) {
      return (Neuron *)0x0;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Neuron replication error: element ");
    poVar5 = std::operator<<(poVar5,(string *)to);
    pcVar7 = " already exists";
  }
  poVar5 = std::operator<<(poVar5,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
  return (Neuron *)0x0;
}

Assistant:

indk::Neuron* indk::NeuralNet::doReplicateNeuron(const std::string& from, const std::string& to, bool integrate) {
    PrepareID = "";

    auto n = Neurons.find(from);
    if (n == Neurons.end()) {
        if (indk::System::getVerbosityLevel() > 0)
            std::cout << "Neuron replication error: element " << from << " not found" << std::endl;
        return nullptr;
    }
    if (Neurons.find(to) != Neurons.end()) {
        if (indk::System::getVerbosityLevel() > 0)
            std::cout << "Neuron replication error: element " << to << " already exists" << std::endl;
        return nullptr;
    }

    auto nnew = new indk::Neuron(*n->second);
    nnew -> setName(to);
    Neurons.insert(std::make_pair(to, nnew));

    if (integrate) {
        auto entries = nnew -> getEntries();
        for (auto &e: entries) {
            auto ne = doFindEntry(e);
            if (ne != -1) {
                Entries[ne].second.push_back(to);
            } else {
                auto nfrom = Neurons.find(e);
                if (nfrom != Neurons.end()) {
                    nfrom -> second -> doLinkOutput(to);
                }
            }
        }

//        bool found = false;
//        for (auto& e: Ensembles) {
//            for (const auto &en: e.second) {
//                if (en == from) {
//                    e.second.push_back(to);
//                    found = true;
//                    break;
//                }
//            }
//            if (found) break;
//        }
    } else {
//        nnew ->  doClearEntries();
    }
    return nnew;
}